

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O0

Long __thiscall amrex::FabArrayBase::TileArray::bytes(TileArray *this)

{
  Long LVar1;
  Long LVar2;
  Long LVar3;
  Long LVar4;
  Long LVar5;
  
  LVar1 = bytesOf<int>((vector<int,_std::allocator<int>_> *)0x129f16c);
  LVar2 = bytesOf<int>((vector<int,_std::allocator<int>_> *)0x129f189);
  LVar3 = bytesOf<int>((vector<int,_std::allocator<int>_> *)0x129f1ab);
  LVar4 = bytesOf<int>((vector<int,_std::allocator<int>_> *)0x129f1cd);
  LVar5 = bytesOf<amrex::Box>((vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x129f1ef);
  return LVar1 + LVar2 + LVar3 + LVar4 + LVar5 + 8;
}

Assistant:

Long
FabArrayBase::TileArray::bytes () const
{
    return sizeof(*this)
        + (amrex::bytesOf(this->numLocalTiles)     - sizeof(this->numLocalTiles))
        + (amrex::bytesOf(this->indexMap)          - sizeof(this->indexMap))
        + (amrex::bytesOf(this->localIndexMap)     - sizeof(this->localIndexMap))
        + (amrex::bytesOf(this->localTileIndexMap) - sizeof(this->localTileIndexMap))
        + (amrex::bytesOf(this->tileArray)         - sizeof(this->tileArray));
}